

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O1

string * jsonify_abi_cxx11_(string *__return_storage_ptr__,string_view in_str)

{
  char __c;
  undefined8 in_RAX;
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  __integer_to_chars_result_type<unsigned_int> _Var4;
  char buffer [2];
  undefined8 uStack_38;
  
  pbVar2 = (byte *)in_str._M_str;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (0 < (long)in_str._M_len) {
    pbVar3 = pbVar2 + in_str._M_len;
    uStack_38 = in_RAX;
    do {
      bVar1 = *pbVar2;
      if (bVar1 == 0x22) {
        bVar1 = 0x22;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,'\\');
LAB_0010bced:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,bVar1);
      }
      else {
        if (bVar1 == 0x5c) {
          bVar1 = 0x5c;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (__return_storage_ptr__,'\\');
          goto LAB_0010bced;
        }
        if (bVar1 < 0x20) {
          if (*pbVar2 == 0) {
            uStack_38._0_7_ = CONCAT16(0x30,(undefined6)uStack_38);
          }
          else {
            _Var4 = std::__detail::__to_chars_16<unsigned_int>
                              ((char *)((long)&uStack_38 + 6),&stack0xffffffffffffffd0,(uint)*pbVar2
                              );
            if (_Var4.ec != 0) goto LAB_0010bcf9;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,"\\u00",4);
          if (*pbVar2 < 0x10) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(__return_storage_ptr__,'0');
            __c = uStack_38._6_1_;
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(__return_storage_ptr__,uStack_38._6_1_);
            __c = uStack_38._7_1_;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (__return_storage_ptr__,__c);
        }
        else {
          if (-1 < (char)bVar1) goto LAB_0010bced;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (__return_storage_ptr__,bVar1);
          bVar1 = *pbVar2;
          if ((bVar1 & 0x40) != 0) {
            if ((bVar1 & 0x20) != 0) {
              if ((bVar1 & 0x10) != 0) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                push_back(__return_storage_ptr__,pbVar2[1]);
                pbVar2 = pbVar2 + 1;
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back(__return_storage_ptr__,pbVar2[1]);
              pbVar2 = pbVar2 + 1;
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(__return_storage_ptr__,pbVar2[1]);
            pbVar2 = pbVar2 + 1;
          }
        }
      }
LAB_0010bcf9:
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 < pbVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string jsonify(std::string_view in_str) {
	const unsigned char *ptr = reinterpret_cast<const unsigned char *>(in_str.data());
	const unsigned char *end_ptr = ptr + in_str.size();
	std::string result;

	while (ptr < end_ptr) {
		if (*ptr == '\\') { // backslash
			result += '\\';
			result += '\\';
		}
		else if (*ptr == '\"') { // quotation
			result += '\\';
			result += '\"';
		}
		else if (*ptr < 0x20) { // control characters
			char buffer[2]; // control codes are only ever going to be at most 2 characters
			if (std::to_chars(buffer, buffer + sizeof(buffer), *ptr, 16).ec == std::errc{}) {
				result += "\\u00"sv;
				if (*ptr > 0xF) {
					result += buffer[0];
					result += buffer[1];
				}
				else {
					result += '0';
					result += buffer[0];
				}
			};
		}
		else if ((*ptr & 0x80) != 0) { // UTF-8 sequence; copy to bypass above processing
			result += *ptr;
			if ((*ptr & 0x40) != 0) {
				// this is a 2+ byte sequence

				if ((*ptr & 0x20) != 0) {
					// this is a 3+ byte sequence

					if ((*ptr & 0x10) != 0) {
						// this is a 4 byte sequnce
						result += *++ptr;
					}

					result += *++ptr;
				}

				result += *++ptr;
			}
		}
		else { // Character in standard ASCII table
			result += *ptr;
		}

		++ptr;
	}

	return result;
}